

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

ON_Xform * ON_Xform::TranslationTransformation(ON_Xform *__return_storage_ptr__,ON_2dVector *delta)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  
  dVar1 = delta->x;
  dVar2 = delta->y;
  pdVar4 = (double *)&IdentityTransformation;
  pdVar5 = (double *)__return_storage_ptr__;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pdVar5 = *pdVar4;
    pdVar4 = pdVar4 + 1;
    pdVar5 = pdVar5 + 1;
  }
  __return_storage_ptr__->m_xform[0][3] = dVar1;
  __return_storage_ptr__->m_xform[1][3] = dVar2;
  __return_storage_ptr__->m_xform[2][3] = 0.0;
  return __return_storage_ptr__;
}

Assistant:

const ON_Xform ON_Xform::TranslationTransformation(
  const ON_2dVector& delta
)
{
  return ON_Xform::TranslationTransformation(delta.x, delta.y, 0.0);
}